

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

double google::protobuf::io::Tokenizer::ParseFloat(string *text)

{
  char *str;
  char *pcVar1;
  LogMessage *pLVar2;
  byte bVar3;
  LogFinisher local_81;
  char *end;
  double local_78;
  string local_70;
  LogMessage local_50;
  
  str = (text->_M_dataplus)._M_p;
  local_78 = NoLocaleStrtod(str,&end);
  bVar3 = *end;
  pcVar1 = end;
  if ((bVar3 | 0x20) == 0x65) {
    bVar3 = end[1];
    if ((bVar3 == 0x2d) || (pcVar1 = end + 1, bVar3 == 0x2b)) {
      bVar3 = end[2];
      pcVar1 = end + 2;
    }
  }
  end = pcVar1;
  if ((bVar3 | 0x20) == 0x66) {
    end = end + 1;
  }
  if (((long)end - (long)str != text->_M_string_length) || (*str == '-')) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x3cc);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,
                        " Tokenizer::ParseFloat() passed text that could not have been tokenized as a float: "
                       );
    CEscape(&local_70,text);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,&local_70);
    internal::LogFinisher::operator=(&local_81,pLVar2);
    std::__cxx11::string::~string((string *)&local_70);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return local_78;
}

Assistant:

double Tokenizer::ParseFloat(const std::string& text) {
  const char* start = text.c_str();
  char* end;
  double result = NoLocaleStrtod(start, &end);

  // "1e" is not a valid float, but if the tokenizer reads it, it will
  // report an error but still return it as a valid token.  We need to
  // accept anything the tokenizer could possibly return, error or not.
  if (*end == 'e' || *end == 'E') {
    ++end;
    if (*end == '-' || *end == '+') ++end;
  }

  // If the Tokenizer had allow_f_after_float_ enabled, the float may be
  // suffixed with the letter 'f'.
  if (*end == 'f' || *end == 'F') {
    ++end;
  }

  GOOGLE_LOG_IF(DFATAL,
         static_cast<size_t>(end - start) != text.size() || *start == '-')
      << " Tokenizer::ParseFloat() passed text that could not have been"
         " tokenized as a float: "
      << CEscape(text);
  return result;
}